

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

void UCAFL::_uc_hook_new_tb(uc_engine *uc,uc_tb *cur_tb,uc_tb *prev_tb,void *user_data)

{
  ssize_t sVar1;
  double extraout_XMM0_Qa;
  double __x;
  double __x_00;
  undefined4 local_34;
  void *pvStack_30;
  afl_child_ret tsl_req;
  UCAFL *ucafl;
  void *user_data_local;
  uc_tb *prev_tb_local;
  uc_tb *cur_tb_local;
  uc_engine *uc_local;
  
  local_34 = 2;
  pvStack_30 = user_data;
  ucafl = (UCAFL *)user_data;
  user_data_local = prev_tb;
  prev_tb_local = cur_tb;
  cur_tb_local = (uc_tb *)uc;
  sVar1 = write(*(int *)((long)user_data + 0x80),&local_34,4);
  __x_00 = extraout_XMM0_Qa;
  if ((sVar1 == 4) &&
     (sVar1 = write(*(int *)((long)pvStack_30 + 0x80),prev_tb_local,8), __x_00 = __x, sVar1 == 8)) {
    log(__x);
    return;
  }
  log(__x_00);
  return;
}

Assistant:

static void _uc_hook_new_tb(uc_engine* uc, uc_tb* cur_tb, uc_tb* prev_tb,
                                void* user_data) {
        UCAFL* ucafl = (UCAFL*)user_data;
        enum afl_child_ret tsl_req = AFL_CHILD_TSL_REQUEST;

        // TODO: Gen unique id for the edge.
        if ((write(_W(ucafl->afl_child_pipe_), &tsl_req,
                   sizeof(enum afl_child_ret))) != sizeof(enum afl_child_ret) ||
            (write(_W(ucafl->afl_child_pipe_), &cur_tb->pc, 8) != 8)) {
            ERR_CHILD("Fail to request cache at 0x%" PRIx64 "\n", cur_tb->pc);
            return;
        }

        ERR_CHILD("A new TB is generated at 0x%" PRIx64 "\n", cur_tb->pc);
    }